

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

int lj_err_unwind_dwarf(int version,int actions,uint64_t uexclass,_Unwind_Exception *uex,
                       _Unwind_Context *ctx)

{
  TValue *pTVar1;
  bool bVar2;
  void *pvVar3;
  GCstr *pGVar4;
  void *pvVar5;
  code *pcVar6;
  ulong uVar7;
  lua_State *L;
  
  if (version != 1) {
    return 3;
  }
  pvVar3 = (void *)_Unwind_GetCFA(ctx);
  L = (lua_State *)(ulong)*(uint *)((long)pvVar3 + 0x18);
  if ((actions & 1U) != 0) {
    pvVar3 = err_unwind(L,pvVar3,0);
    if (pvVar3 == (void *)0x0) {
      return 8;
    }
    if (0xff < (uexclass ^ 0x4c55414a49543200)) {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pGVar4 = lj_err_str(L,LJ_ERR_ERRCPP);
      (pTVar1->u32).lo = (uint32_t)pGVar4;
      (pTVar1->field_2).it = 0xfffffffb;
      return 6;
    }
    return 6;
  }
  if ((actions & 2U) == 0) {
    return 8;
  }
  if ((uexclass ^ 0x4c55414a49543200) < 0x100) {
    uVar7 = uexclass & 0xff;
  }
  else {
    uVar7 = 2;
    if ((actions & 4U) != 0) {
      _Unwind_DeleteException(uex);
    }
  }
  pvVar5 = err_unwind(L,pvVar3,(int)uVar7);
  if ((actions & 8U) == 0) {
    if (pvVar5 == (void *)0x0) {
      if ((actions & 4U) == 0) {
        bVar2 = true;
        goto LAB_001139f7;
      }
      _Unwind_SetGR(ctx,0,uVar7);
      pcVar6 = lj_vm_unwind_rethrow;
    }
    else {
      _Unwind_SetGR(ctx,0,uVar7);
      pcVar6 = lj_vm_unwind_ff_eh;
      if (((ulong)pvVar5 & 2) == 0) {
        pcVar6 = lj_vm_unwind_c_eh;
      }
    }
    _Unwind_SetIP(ctx,pcVar6);
    pvVar3 = (void *)0x7;
  }
  else {
    pvVar3 = (void *)0x8;
  }
  bVar2 = false;
LAB_001139f7:
  if (bVar2) {
    return 8;
  }
  return (int)pvVar3;
}

Assistant:

LJ_FUNCA int lj_err_unwind_dwarf(int version, int actions,
  uint64_t uexclass, _Unwind_Exception *uex, _Unwind_Context *ctx)
{
  void *cf;
  lua_State *L;
  if (version != 1)
    return _URC_FATAL_PHASE1_ERROR;
  cf = (void *)_Unwind_GetCFA(ctx);
  L = cframe_L(cf);
  if ((actions & _UA_SEARCH_PHASE)) {
#if LJ_UNWIND_EXT
    if (err_unwind(L, cf, 0) == NULL)
      return _URC_CONTINUE_UNWIND;
#endif
    if (!LJ_UEXCLASS_CHECK(uexclass)) {
      setstrV(L, L->top++, lj_err_str(L, LJ_ERR_ERRCPP));
    }
    return _URC_HANDLER_FOUND;
  }
  if ((actions & _UA_CLEANUP_PHASE)) {
    int errcode;
    if (LJ_UEXCLASS_CHECK(uexclass)) {
      errcode = LJ_UEXCLASS_ERRCODE(uexclass);
    } else {
      if ((actions & _UA_HANDLER_FRAME))
	_Unwind_DeleteException(uex);
      errcode = LUA_ERRRUN;
    }
#if LJ_UNWIND_EXT
    cf = err_unwind(L, cf, errcode);
    if ((actions & _UA_FORCE_UNWIND)) {
      return _URC_CONTINUE_UNWIND;
    } else if (cf) {
      _Unwind_SetGR(ctx, LJ_TARGET_EHRETREG, errcode);
      _Unwind_SetIP(ctx, (uintptr_t)(cframe_unwind_ff(cf) ?
				     lj_vm_unwind_ff_eh :
				     lj_vm_unwind_c_eh));
      return _URC_INSTALL_CONTEXT;
    }
#if LJ_TARGET_X86ORX64
    else if ((actions & _UA_HANDLER_FRAME)) {
      /* Workaround for ancient libgcc bug. Still present in RHEL 5.5. :-/
      ** Real fix: http://gcc.gnu.org/viewcvs/trunk/gcc/unwind-dw2.c?r1=121165&r2=124837&pathrev=153877&diff_format=h
      */
      _Unwind_SetGR(ctx, LJ_TARGET_EHRETREG, errcode);
      _Unwind_SetIP(ctx, (uintptr_t)lj_vm_unwind_rethrow);
      return _URC_INSTALL_CONTEXT;
    }
#endif
#else
    /* This is not the proper way to escape from the unwinder. We get away with
    ** it on non-x64 because the interpreter restores all callee-saved regs.
    */
    lj_err_throw(L, errcode);
#if LJ_TARGET_X64
#error "Broken build system -- only use the provided Makefiles!"
#endif
#endif
  }
  return _URC_CONTINUE_UNWIND;
}